

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_setup(nk_context *ctx,nk_user_font *font)

{
  if (ctx != (nk_context *)0x0) {
    nk_zero(ctx,0x40f0);
    nk_style_default(ctx);
    ctx->seq = 1;
    if (font != (nk_user_font *)0x0) {
      (ctx->style).font = font;
    }
    nk_draw_list_init(&ctx->draw_list);
    return;
  }
  __assert_fail("ctx",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                ,0x3a1b,"void nk_setup(struct nk_context *, const struct nk_user_font *)");
}

Assistant:

NK_INTERN void
nk_setup(struct nk_context *ctx, const struct nk_user_font *font)
{
    NK_ASSERT(ctx);
    if (!ctx) return;
    nk_zero_struct(*ctx);
    nk_style_default(ctx);
    ctx->seq = 1;
    if (font) ctx->style.font = font;
#ifdef NK_INCLUDE_VERTEX_BUFFER_OUTPUT
    nk_draw_list_init(&ctx->draw_list);
#endif
}